

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

Status __thiscall
soplex::SLUFactor<double>::change
          (SLUFactor<double> *this,int idx,SVectorBase<double> *subst,SSVectorBase<double> *e)

{
  CLUFactor<double> *this_00;
  Status SVar1;
  int num;
  double *p_work;
  int *nonz;
  
  if (this->usetup == true) {
    if ((this->super_CLUFactor<double>).l.updateType != 1) {
LAB_001d637c:
      changeEta(this,idx,&this->eta);
      goto LAB_001d6381;
    }
    num = (this->forest).super_IdxSet.num;
    p_work = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->forest).setupStatus = false;
    nonz = (this->forest).super_IdxSet.idx;
  }
  else {
    this_00 = &this->super_CLUFactor<double>;
    if (e != (SSVectorBase<double> *)0x0) {
      (this->super_CLUFactor<double>).l.updateType = 0;
      CLUFactor<double>::updateNoClear
                (this_00,idx,
                 (e->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start,(e->super_IdxSet).idx,(e->super_IdxSet).num);
      (this->super_CLUFactor<double>).l.updateType = this->uptype;
      goto LAB_001d6381;
    }
    if ((this->super_CLUFactor<double>).l.updateType != 1) {
      VectorBase<double>::operator=(&this->vec,subst);
      SSVectorBase<double>::clear(&this->eta);
      (this->eta).setupStatus = false;
      CLUFactor<double>::solveRight
                (this_00,(this->eta).super_VectorBase<double>.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      goto LAB_001d637c;
    }
    SSVectorBase<double>::operator=(&this->forest,subst);
    (this->forest).setupStatus = false;
    CLUFactor<double>::solveLright
              (this_00,(this->forest).super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    (this->forest).setupStatus = false;
    p_work = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    num = 0;
    nonz = (int *)0x0;
  }
  CLUFactor<double>::forestUpdate(&this->super_CLUFactor<double>,idx,p_work,num,nonz);
  (this->forest).super_IdxSet.num = 0;
  (this->forest).setupStatus = true;
LAB_001d6381:
  this->usetup = false;
  (*(this->super_SLinSolver<double>)._vptr_SLinSolver[6])(this);
  SVar1 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[1])(this);
  return SVar1;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::change(
   int             idx,
   const SVectorBase<R>&  subst,
   const SSVectorBase<R>* e)
{

   // BH 2005-08-23: The boolean usetup indicates that an "update VectorBase<R>"
   // has been set up. I suppose that SSVectorBase<R>  forest is this
   // update VectorBase<R>, which is set up by solveRight4update() and
   // solve2right4update() in order to optimize the basis update.

   if(usetup)
   {
      if(this->l.updateType == FOREST_TOMLIN)               // FOREST_TOMLIN updates
      {
         // BH 2005-08-19: The size of a SSVectorBase<R>  is the size of the
         // index set, i.e.  the number of nonzeros which is only
         // defined if the SSVectorBase<R>  is set up.  Since
         // SSVectorBase<R> ::altValues() calls unSetup() the size needs to be
         // stored before the following call.
         int fsize = forest.size(); // see altValues()
         this->forestUpdate(idx, forest.altValues(), fsize, forest.altIndexMem());
         forest.setSize(0);
         forest.forceSetup();
      }
      else
      {
         assert(this->l.updateType == ETA);
         changeEta(idx, eta);
      }
   }
   else if(e != nullptr)                                    // ETA updates
   {
      this->l.updateType = ETA;
      this->updateNoClear(idx, e->values(), e->indexMem(), e->size());
      this->l.updateType = uptype;
   }
   else if(this->l.updateType == FOREST_TOMLIN)             // FOREST_TOMLIN updates
   {
      assert(0);  // probably this part is never called.
      // forestUpdate() with the last parameter set to NULL should fail.
      forest = subst;
      CLUFactor<R>::solveLright(forest.altValues());
      this->forestUpdate(idx, forest.altValues(), 0, nullptr);
      forest.setSize(0);
      forest.forceSetup();
   }
   else                                               // ETA updates
   {
      assert(this->l.updateType == ETA);
      vec = subst;
      eta.clear();
      CLUFactor<R>::solveRight(eta.altValues(), vec.get_ptr());
      changeEta(idx, eta);
   }

   usetup = false;

   SPxOut::debug(this, "DSLUFA01\tupdated\t\tstability = {}\n", stability());

   return status();
}